

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

void __thiscall
embree::SceneGraph::GroupNode::set(GroupNode *this,size_t i,Ref<embree::SceneGraph::Node> *node)

{
  pointer pRVar1;
  Node *pNVar2;
  
  pRVar1 = (this->children).
           super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (node->ptr != (Node *)0x0) {
    (*(node->ptr->super_RefCount)._vptr_RefCount[2])();
  }
  pNVar2 = pRVar1[i].ptr;
  if (pNVar2 != (Node *)0x0) {
    (*(pNVar2->super_RefCount)._vptr_RefCount[3])();
  }
  pRVar1[i].ptr = node->ptr;
  return;
}

Assistant:

void set(const size_t i, const Ref<Node>& node) {
        children[i] = node;
      }